

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O2

void add_csc_range_penalty<PredictionData<double,int>>
               (WorkerForPredictCSC *workspace,PredictionData<double,_int> *prediction_data,
               double *weights_arr,size_t col_num,double range_low,double range_high)

{
  int iVar1;
  pointer puVar2;
  size_t sVar3;
  int *piVar4;
  pointer pdVar5;
  unsigned_long uVar6;
  unsigned_long *puVar7;
  int *piVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  double dVar14;
  
  puVar2 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (puVar2 + workspace->st,puVar2 + workspace->end + 1);
  lVar13 = (long)prediction_data->Xc_indptr[col_num];
  lVar10 = (long)prediction_data->Xc_indptr[col_num + 1];
  uVar12 = (ulong)prediction_data->Xc_ind[lVar10 + -1];
  puVar2 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar7 = std::__lower_bound<unsigned_long*,int,__gnu_cxx::__ops::_Iter_less_val>
                     (puVar2 + workspace->st,puVar2 + workspace->end + 1,
                      prediction_data->Xc_ind + lVar13);
  if ((0.0 < range_low) || (range_high < 0.0)) {
    uVar11 = workspace->st;
    uVar9 = workspace->end;
    if (weights_arr == (double *)0x0) {
      puVar2 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar5 = (workspace->depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (; uVar11 <= uVar9; uVar11 = uVar11 + 1) {
        uVar6 = puVar2[uVar11];
        pdVar5[uVar6] = pdVar5[uVar6] + -1.0;
      }
    }
    else {
      puVar2 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar5 = (workspace->depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (; uVar11 <= uVar9; uVar11 = uVar11 + 1) {
        uVar6 = puVar2[uVar11];
        pdVar5[uVar6] = pdVar5[uVar6] - weights_arr[uVar6];
      }
    }
    do {
      puVar2 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (((puVar7 == puVar2 + uVar9 + 1) || (lVar13 == lVar10)) ||
         (uVar11 = *puVar7, uVar12 < uVar11)) {
        return;
      }
      piVar4 = prediction_data->Xc_ind;
      piVar8 = piVar4 + lVar13;
      iVar1 = *piVar8;
      if (iVar1 == (int)uVar11) {
        dVar14 = prediction_data->Xc[lVar13];
        if ((NAN(dVar14)) || ((range_low <= dVar14 && (dVar14 <= range_high)))) {
          dVar14 = 1.0;
          if (weights_arr != (double *)0x0) {
            dVar14 = weights_arr[uVar11];
          }
          pdVar5 = (workspace->depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar5[uVar11] = dVar14 + pdVar5[uVar11];
        }
        if (puVar7 == puVar2 + uVar9) {
          return;
        }
        if (lVar13 == lVar10 + -1) {
          return;
        }
        puVar7 = puVar7 + 1;
LAB_001b4284:
        piVar8 = std::__lower_bound<int*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                           (piVar8 + 1,piVar4 + lVar10,puVar7);
        lVar13 = (long)piVar8 - (long)prediction_data->Xc_ind >> 2;
      }
      else {
        if (iVar1 <= (int)uVar11) goto LAB_001b4284;
        puVar7 = std::__lower_bound<unsigned_long*,int,__gnu_cxx::__ops::_Iter_less_val>(puVar7 + 1)
        ;
      }
      uVar9 = workspace->end;
    } while( true );
  }
  do {
    while( true ) {
      puVar2 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar3 = workspace->end;
      if (puVar7 == puVar2 + sVar3 + 1) {
        return;
      }
      if (lVar13 == lVar10) {
        return;
      }
      uVar11 = *puVar7;
      if (uVar12 < uVar11) {
        return;
      }
      piVar4 = prediction_data->Xc_ind;
      piVar8 = piVar4 + lVar13;
      iVar1 = *piVar8;
      if (iVar1 == (int)uVar11) break;
      if (iVar1 <= (int)uVar11) goto LAB_001b412d;
      puVar7 = std::__lower_bound<unsigned_long*,int,__gnu_cxx::__ops::_Iter_less_val>(puVar7 + 1);
    }
    dVar14 = prediction_data->Xc[lVar13];
    if ((!NAN(dVar14)) && ((dVar14 < range_low || (range_high < dVar14)))) {
      dVar14 = 1.0;
      if (weights_arr != (double *)0x0) {
        dVar14 = weights_arr[uVar11];
      }
      pdVar5 = (workspace->depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5[uVar11] = pdVar5[uVar11] - dVar14;
    }
    if (puVar7 == puVar2 + sVar3) {
      return;
    }
    if (lVar13 == lVar10 + -1) {
      return;
    }
    puVar7 = puVar7 + 1;
LAB_001b412d:
    piVar8 = std::__lower_bound<int*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                       (piVar8 + 1,piVar4 + lVar10,puVar7);
    lVar13 = (long)piVar8 - (long)prediction_data->Xc_ind >> 2;
  } while( true );
}

Assistant:

void add_csc_range_penalty(WorkerForPredictCSC     &workspace,
                           const PredictionData    &prediction_data,
                           const double *restrict  weights_arr,
                           size_t                  col_num,
                           double                  range_low,
                           double                  range_high)
{
    std::sort(workspace.ix_arr.begin() + workspace.st, workspace.ix_arr.begin() + workspace.end + 1);

    size_t st_col  = prediction_data.Xc_indptr[col_num];
    size_t end_col = prediction_data.Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = prediction_data.Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(workspace.ix_arr.data() + workspace.st,
                                      workspace.ix_arr.data() + workspace.end + 1,
                                      prediction_data.Xc_ind[st_col]);

    if (range_low <= 0 && range_high >= 0)
    {
        for (size_t *row = ptr_st;
             row != workspace.ix_arr.data() + workspace.end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (prediction_data.Xc_ind[curr_pos] == (decltype(*prediction_data.Xc_ind))(*row))
            {
                if (likely(!std::isnan(prediction_data.Xc[curr_pos])
                               &&
                           (   prediction_data.Xc[curr_pos] < range_low    ||
                               prediction_data.Xc[curr_pos] > range_high   )))
                {
                    workspace.depths[*row] -= (weights_arr == NULL)? 1. : weights_arr[*row];
                }
                
                if (row == workspace.ix_arr.data() + workspace.end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(prediction_data.Xc_ind + curr_pos + 1,
                                            prediction_data.Xc_ind + end_col  + 1,
                                            *(++row))
                                - prediction_data.Xc_ind;
            }

            else
            {
                if (prediction_data.Xc_ind[curr_pos] > (decltype(*prediction_data.Xc_ind))(*row))
                    row = std::lower_bound(row + 1,
                                           workspace.ix_arr.data() + workspace.end + 1,
                                           prediction_data.Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(prediction_data.Xc_ind + curr_pos + 1,
                                                prediction_data.Xc_ind + end_col  + 1,
                                                *row)
                                    - prediction_data.Xc_ind;
            }
        }
    }

    else
    {
        if (likely(weights_arr == NULL))
            for (size_t row = workspace.st; row <= workspace.end; row++)
                workspace.depths[workspace.ix_arr[row]]--;
        else
            for (size_t row = workspace.st; row <= workspace.end; row++)
                workspace.depths[workspace.ix_arr[row]] -= weights_arr[workspace.ix_arr[row]];


        for (size_t *row = ptr_st;
             row != workspace.ix_arr.data() + workspace.end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (prediction_data.Xc_ind[curr_pos] == (decltype(*prediction_data.Xc_ind))(*row))
            {
                if (likely(std::isnan(prediction_data.Xc[curr_pos])
                               ||
                           (   prediction_data.Xc[curr_pos] >= range_low    &&
                               prediction_data.Xc[curr_pos] <= range_high   )))
                {
                    workspace.depths[*row] += (weights_arr == NULL)? 1. : weights_arr[*row];
                }
                
                if (row == workspace.ix_arr.data() + workspace.end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(prediction_data.Xc_ind + curr_pos + 1,
                                            prediction_data.Xc_ind + end_col  + 1,
                                            *(++row))
                                - prediction_data.Xc_ind;
            }

            else
            {
                if (prediction_data.Xc_ind[curr_pos] > (decltype(*prediction_data.Xc_ind))(*row))
                    row = std::lower_bound(row + 1,
                                           workspace.ix_arr.data() + workspace.end + 1,
                                           prediction_data.Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(prediction_data.Xc_ind + curr_pos + 1,
                                                prediction_data.Xc_ind + end_col  + 1,
                                                *row)
                                    - prediction_data.Xc_ind;
            }
        }
    }
}